

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall
glslang::HlslGrammar::acceptDefaultParameterDeclaration
          (HlslGrammar *this,TType *type,TIntermTyped **node)

{
  HlslToken *loc;
  TIntermediate *this_00;
  HlslParseContext *this_01;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermTyped *pTVar3;
  TFunction *function;
  undefined4 extraout_var_01;
  long lVar4;
  undefined4 extraout_var_02;
  long lVar5;
  TIntermTyped *pTVar6;
  undefined4 extraout_var_03;
  TIntermTyped *arguments;
  TIntermTyped *local_38;
  
  *node = (TIntermTyped *)0x0;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
  if (!bVar1) {
    return true;
  }
  bVar1 = acceptConditionalExpression(this,node);
  if (!bVar1) {
    bVar1 = acceptInitializer(this,node);
    if (!bVar1) {
      return false;
    }
    loc = &(this->super_HlslTokenStream).token;
    function = HlslParseContext::makeConstructorCall(this->parseContext,&loc->loc,type);
    if (function == (TFunction *)0x0) {
      return false;
    }
    local_38 = (TIntermTyped *)0x0;
    iVar2 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[6])();
    lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 400))
                      ((long *)CONCAT44(extraout_var_01,iVar2));
    if (0 < (int)((ulong)(*(long *)(lVar4 + 0x10) - *(long *)(lVar4 + 8)) >> 3)) {
      lVar4 = 0;
      do {
        this_01 = this->parseContext;
        iVar2 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[6])();
        lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 400))
                          ((long *)CONCAT44(extraout_var_02,iVar2));
        pTVar6 = (TIntermTyped *)
                 (**(code **)(**(long **)(*(long *)(lVar5 + 8) + lVar4 * 8) + 0x18))();
        HlslParseContext::handleFunctionArgument(this_01,function,&local_38,pTVar6);
        lVar4 = lVar4 + 1;
        iVar2 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[6])();
        lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 400))
                          ((long *)CONCAT44(extraout_var_03,iVar2));
      } while (lVar4 < (int)((ulong)(*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8)) >> 3));
    }
    pTVar6 = HlslParseContext::handleFunctionCall(this->parseContext,&loc->loc,function,*node);
    *node = pTVar6;
    if (function == (TFunction *)0x0) {
      return false;
    }
  }
  if (*node == (TIntermTyped *)0x0) {
    return false;
  }
  iVar2 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[5])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    pTVar6 = *node;
    this_00 = this->intermediate;
    iVar2 = (*(pTVar6->super_TIntermNode)._vptr_TIntermNode[6])(pTVar6);
    pTVar3 = TIntermediate::fold(this_00,(TIntermAggregate *)CONCAT44(extraout_var_00,iVar2));
    *node = pTVar3;
    if (pTVar3 == (TIntermTyped *)0x0 || pTVar6 == pTVar3) {
      (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
        [0x2d])(this->parseContext,&(this->super_HlslTokenStream).token,
                "invalid default parameter value","","");
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool HlslGrammar::acceptDefaultParameterDeclaration(const TType& type, TIntermTyped*& node)
{
    node = nullptr;

    // Valid not to have a default_parameter_declaration
    if (!acceptTokenClass(EHTokAssign))
        return true;

    if (!acceptConditionalExpression(node)) {
        if (!acceptInitializer(node))
            return false;

        // For initializer lists, we have to const-fold into a constructor for the type, so build
        // that.
        TFunction* constructor = parseContext.makeConstructorCall(token.loc, type);
        if (constructor == nullptr)  // cannot construct
            return false;

        TIntermTyped* arguments = nullptr;
        for (int i = 0; i < int(node->getAsAggregate()->getSequence().size()); i++)
            parseContext.handleFunctionArgument(constructor, arguments, node->getAsAggregate()->getSequence()[i]->getAsTyped());

        node = parseContext.handleFunctionCall(token.loc, constructor, node);
    }

    if (node == nullptr)
        return false;

    // If this is simply a constant, we can use it directly.
    if (node->getAsConstantUnion())
        return true;

    // Otherwise, it has to be const-foldable.
    TIntermTyped* origNode = node;

    node = intermediate.fold(node->getAsAggregate());

    if (node != nullptr && origNode != node)
        return true;

    parseContext.error(token.loc, "invalid default parameter value", "", "");

    return false;
}